

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O2

void __thiscall Response::Status::Status(Status *this,int code)

{
  (this->status)._M_dataplus._M_p = (pointer)&(this->status).field_2;
  (this->status)._M_string_length = 0;
  (this->status).field_2._M_local_buf[0] = '\0';
  this->code = code;
  if ((((code == 0x195) || (code == 0x193)) || (code == 0x194)) || (code == 200)) {
    std::__cxx11::string::assign((char *)this);
  }
  return;
}

Assistant:

Response::Status::Status(int code) : code(code) {
    switch (code) {
    case 200:
        status = "OK";
        break;
    case 403:
        status = "FORBIDDEN";
        break;
    case 404:
        status = "NOT FOUND";
        break;
    case 405:
        status = "METHOD NOT ALLOWED";
        break;
    }
}